

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

size_t reserve_space_for_data_in_tmp
                 (estate s,FFSBuffer buf,void *data,size_t length,int req_alignment,
                 size_t *tmp_data_loc)

{
  size_t sVar1;
  size_t in_RCX;
  size_t in_RDX;
  FFSBuffer in_RSI;
  estate in_RDI;
  undefined4 in_R8D;
  size_t *in_R9;
  size_t msg_offset;
  size_t tmp_data;
  size_t local_38;
  undefined4 in_stack_ffffffffffffffd8;
  
  sVar1 = allocate_tmp_space(in_RDI,in_RSI,in_RDX,(int)(in_RCX >> 0x20),
                             (size_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  if (in_RCX != 0) {
    in_RDI->iovec[in_RDI->iovcnt].iov_len = in_RCX;
    in_RDI->iovec[in_RDI->iovcnt].iov_offset = local_38;
    in_RDI->iovec[in_RDI->iovcnt].iov_base = (void *)0x0;
    in_RDI->iovcnt = in_RDI->iovcnt + 1;
  }
  if (in_R9 != (size_t *)0x0) {
    *in_R9 = local_38;
  }
  return sVar1;
}

Assistant:

size_t
reserve_space_for_data_in_tmp(estate s, FFSBuffer buf, void *data, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    size_t tmp_data;
    size_t msg_offset = allocate_tmp_space(s, buf, length, req_alignment, &tmp_data);
    if (length != 0) {
	s->iovec[s->iovcnt].iov_len = length;
	s->iovec[s->iovcnt].iov_offset = tmp_data;
	s->iovec[s->iovcnt].iov_base = NULL;
	s->iovcnt++;
    }
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    return msg_offset;
}